

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall APathFollower::Activate(APathFollower *this,AActor *activator)

{
  bool bVar1;
  AInterpolationPoint *pAVar2;
  DVector3 local_30;
  AActor *local_18;
  AActor *activator_local;
  APathFollower *this_local;
  
  if (((this->super_AActor).field_0x499 & 1) == 0) {
    local_18 = activator;
    activator_local = &this->super_AActor;
    pAVar2 = barrier_cast<AInterpolationPoint*,AActor>(&(this->super_AActor).target);
    TObjPtr<AInterpolationPoint>::operator=(&this->CurrNode,pAVar2);
    pAVar2 = barrier_cast<AInterpolationPoint*,AActor>(&(this->super_AActor).lastenemy);
    TObjPtr<AInterpolationPoint>::operator=(&this->PrevNode,pAVar2);
    bVar1 = TObjPtr<AInterpolationPoint>::operator!=(&this->CurrNode,(AInterpolationPoint *)0x0);
    if (bVar1) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x26])();
      pAVar2 = TObjPtr<AInterpolationPoint>::operator->(&this->CurrNode);
      AActor::Pos(&local_30,&pAVar2->super_AActor);
      AActor::SetOrigin(&this->super_AActor,&local_30,false);
      this->Time = 0.0;
      this->HoldTime = 0;
      (this->super_AActor).field_0x49a = 1;
      (this->super_AActor).field_0x499 = 1;
    }
  }
  return;
}

Assistant:

void APathFollower::Activate (AActor *activator)
{
	if (!bActive)
	{
		CurrNode = barrier_cast<AInterpolationPoint *>(target);
		PrevNode = barrier_cast<AInterpolationPoint *>(lastenemy);

		if (CurrNode != NULL)
		{
			NewNode ();
			SetOrigin (CurrNode->Pos(), false);
			Time = 0.f;
			HoldTime = 0;
			bJustStepped = true;
			bActive = true;
		}
	}
}